

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O1

void blowfish_lsb_encrypt_ecb(void *vblk,int len,BlowfishContext *ctx)

{
  undefined8 in_RAX;
  int iVar1;
  uint8_t *p;
  uint32_t out [2];
  undefined8 local_28;
  
  if ((len & 7U) == 0) {
    if (0 < len) {
      iVar1 = len + 8;
      local_28 = in_RAX;
      do {
        blowfish_encrypt(*vblk,*(uint32_t *)((long)vblk + 4),(uint32_t *)&local_28,ctx);
        *(uint32_t *)vblk = (uint32_t)local_28;
        *(uint32_t *)((long)vblk + 4) = local_28._4_4_;
        vblk = (void *)((long)vblk + 8);
        iVar1 = iVar1 + -8;
      } while (8 < iVar1);
    }
    return;
  }
  __assert_fail("(len & 7) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/blowfish.c"
                ,0x14f,"void blowfish_lsb_encrypt_ecb(void *, int, BlowfishContext *)");
}

Assistant:

void blowfish_lsb_encrypt_ecb(void *vblk, int len, BlowfishContext * ctx)
{
    unsigned char *blk = (unsigned char *)vblk;
    uint32_t xL, xR, out[2];

    assert((len & 7) == 0);

    while (len > 0) {
        xL = GET_32BIT_LSB_FIRST(blk);
        xR = GET_32BIT_LSB_FIRST(blk + 4);
        blowfish_encrypt(xL, xR, out, ctx);
        PUT_32BIT_LSB_FIRST(blk, out[0]);
        PUT_32BIT_LSB_FIRST(blk + 4, out[1]);
        blk += 8;
        len -= 8;
    }
}